

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_dc_left_predictor_4x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  short sVar4;
  short sVar6;
  short sVar7;
  short sVar8;
  
  auVar2 = *(undefined1 (*) [16])left;
  sVar4 = auVar2._8_2_;
  auVar5._0_2_ = sVar4 + auVar2._0_2_;
  sVar6 = auVar2._10_2_;
  auVar5._2_2_ = sVar6 + auVar2._2_2_;
  sVar7 = auVar2._12_2_;
  auVar5._4_2_ = sVar7 + auVar2._4_2_;
  sVar8 = auVar2._14_2_;
  auVar5._6_2_ = sVar8 + auVar2._6_2_;
  auVar5._8_2_ = sVar4;
  auVar5._10_2_ = sVar6;
  auVar5._12_2_ = sVar7;
  auVar5._14_2_ = sVar8;
  auVar2 = pshuflw(auVar2,auVar5,0xe);
  auVar3._0_2_ = auVar2._0_2_ + auVar5._0_2_;
  auVar3._2_2_ = auVar2._2_2_ + auVar5._2_2_;
  auVar3._4_2_ = auVar2._4_2_ + auVar5._4_2_;
  auVar3._6_2_ = auVar2._6_2_ + auVar5._6_2_;
  auVar3._8_2_ = auVar2._8_2_ + sVar4;
  auVar3._10_2_ = auVar2._10_2_ + sVar6;
  auVar3._12_2_ = auVar2._12_2_ + sVar7;
  auVar3._14_2_ = auVar2._14_2_ + sVar8;
  auVar2._0_2_ = auVar3._2_2_ + auVar3._0_2_ + 4;
  auVar2._2_2_ = auVar3._2_2_;
  auVar2._4_2_ = auVar3._6_2_ + auVar3._4_2_ + 4;
  auVar2._6_2_ = auVar3._6_2_;
  auVar2._8_2_ = auVar3._10_2_ + auVar3._8_2_ + 4;
  auVar2._10_2_ = auVar3._10_2_;
  auVar2._12_2_ = auVar3._14_2_ + auVar3._12_2_ + 4;
  auVar2._14_2_ = auVar3._14_2_;
  auVar2 = pshuflw(auVar3,auVar2,0);
  iVar1 = 8;
  do {
    *(ulong *)dst =
         CONCAT26(auVar2._6_2_ >> 3,
                  CONCAT24(auVar2._4_2_ >> 3,CONCAT22(auVar2._2_2_ >> 3,auVar2._0_2_ >> 3)));
    dst = dst + stride;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void aom_highbd_dc_left_predictor_4x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                           const uint16_t *above,
                                           const uint16_t *left, int bd) {
  const __m128i sum = dc_sum_8(left);
  const __m128i four = _mm_cvtsi32_si128(4);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, four), 3);
  (void)above;
  (void)bd;
  dc_store_4x8(dst, stride, &dc);
}